

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O1

char * FIX::socket_peername(socket_handle socket)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  socklen_t len;
  sockaddr_in addr;
  socklen_t local_14;
  undefined1 local_10 [16];
  
  local_14 = 0x10;
  iVar1 = getpeername(socket,(sockaddr *)local_10,&local_14);
  if (iVar1 < 0) {
    pcVar3 = "UNKNOWN";
  }
  else {
    pcVar2 = inet_ntoa((in_addr)local_10._4_4_);
    pcVar3 = "UNKNOWN";
    if (pcVar2 != (char *)0x0) {
      pcVar3 = pcVar2;
    }
  }
  return pcVar3;
}

Assistant:

const char *socket_peername(socket_handle socket) {
  struct sockaddr_in addr;
  socklen_t len = sizeof(addr);
  if (getpeername(socket, (struct sockaddr *)&addr, &len) < 0) {
    return "UNKNOWN";
  }
  char *result = inet_ntoa(addr.sin_addr);
  if (result) {
    return result;
  } else {
    return "UNKNOWN";
  }
}